

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_shift_flags(DisasContext *s,MemOp ot,TCGv_i64 result,TCGv_i64 shm1,TCGv_i64 count,
                    _Bool is_right)

{
  TCGContext *tcg_ctx_00;
  TCGv_i64 c2;
  TCGv_i32 c2_00;
  TCGv_i32 ret;
  int iVar1;
  TCGv_i64 z_tl;
  TCGv_i32 oldop;
  TCGv_i32 s32;
  TCGv_i32 z32;
  TCGContext *tcg_ctx;
  _Bool is_right_local;
  TCGv_i64 count_local;
  TCGv_i64 shm1_local;
  TCGv_i64 result_local;
  MemOp ot_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  c2 = tcg_const_i64_x86_64(tcg_ctx_00,0);
  if (("\a\x02\x03\x03\x03\x03\x03\x03\x03\x03\a\a\a\a\v\v\v\v\a\a\a\a\x01\x01\x01\x01\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x06\a"
       [s->cc_op] & 1) == 0) {
    tcg_gen_mov_i64_x86_64(tcg_ctx_00,tcg_ctx_00->cpu_cc_dst,result);
  }
  else {
    tcg_gen_movcond_i64_x86_64
              (tcg_ctx_00,TCG_COND_NE,tcg_ctx_00->cpu_cc_dst,count,c2,result,tcg_ctx_00->cpu_cc_dst)
    ;
  }
  if (("\a\x02\x03\x03\x03\x03\x03\x03\x03\x03\a\a\a\a\v\v\v\v\a\a\a\a\x01\x01\x01\x01\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x06\a"
       [s->cc_op] & 2) == 0) {
    tcg_gen_mov_i64_x86_64(tcg_ctx_00,tcg_ctx_00->cpu_cc_src,shm1);
  }
  else {
    tcg_gen_movcond_i64_x86_64
              (tcg_ctx_00,TCG_COND_NE,tcg_ctx_00->cpu_cc_src,count,c2,shm1,tcg_ctx_00->cpu_cc_src);
  }
  tcg_temp_free_i64(tcg_ctx_00,c2);
  iVar1 = 0x22;
  if (is_right) {
    iVar1 = 0x26;
  }
  tcg_gen_movi_i32(tcg_ctx_00,s->tmp2_i32,iVar1 + ot);
  if (s->cc_op == CC_OP_DYNAMIC) {
    z_tl = (TCGv_i64)tcg_ctx_00->cpu_cc_op;
  }
  else {
    tcg_gen_movi_i32(tcg_ctx_00,s->tmp3_i32,s->cc_op);
    z_tl = (TCGv_i64)s->tmp3_i32;
  }
  c2_00 = tcg_const_i32_x86_64(tcg_ctx_00,0);
  ret = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_extrl_i64_i32_x86_64(tcg_ctx_00,ret,count);
  tcg_gen_movcond_i32_x86_64
            (tcg_ctx_00,TCG_COND_NE,tcg_ctx_00->cpu_cc_op,ret,c2_00,s->tmp2_i32,(TCGv_i32)z_tl);
  tcg_temp_free_i32(tcg_ctx_00,c2_00);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  set_cc_op(s,CC_OP_DYNAMIC);
  return;
}

Assistant:

static void gen_shift_flags(DisasContext *s, MemOp ot, TCGv result,
                            TCGv shm1, TCGv count, bool is_right)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 z32, s32, oldop;
    TCGv z_tl;

    /* Store the results into the CC variables.  If we know that the
       variable must be dead, store unconditionally.  Otherwise we'll
       need to not disrupt the current contents.  */
    z_tl = tcg_const_tl(tcg_ctx, 0);
    if (cc_op_live[s->cc_op] & USES_CC_DST) {
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_cc_dst, count, z_tl,
                           result, tcg_ctx->cpu_cc_dst);
    } else {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_dst, result);
    }
    if (cc_op_live[s->cc_op] & USES_CC_SRC) {
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_cc_src, count, z_tl,
                           shm1, tcg_ctx->cpu_cc_src);
    } else {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src, shm1);
    }
    tcg_temp_free(tcg_ctx, z_tl);

    /* Get the two potential CC_OP values into temporaries.  */
    tcg_gen_movi_i32(tcg_ctx, s->tmp2_i32, (is_right ? CC_OP_SARB : CC_OP_SHLB) + ot);
    if (s->cc_op == CC_OP_DYNAMIC) {
        oldop = tcg_ctx->cpu_cc_op;
    } else {
        tcg_gen_movi_i32(tcg_ctx, s->tmp3_i32, s->cc_op);
        oldop = s->tmp3_i32;
    }

    /* Conditionally store the CC_OP value.  */
    z32 = tcg_const_i32(tcg_ctx, 0);
    s32 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_trunc_tl_i32(tcg_ctx, s32, count);
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_cc_op, s32, z32, s->tmp2_i32, oldop);
    tcg_temp_free_i32(tcg_ctx, z32);
    tcg_temp_free_i32(tcg_ctx, s32);

    /* The CC_OP value is no longer predictable.  */
    set_cc_op(s, CC_OP_DYNAMIC);
}